

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O0

void __thiscall sznet::net::Buffer::wrapBuffer(Buffer *this)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  size_t writeSize;
  char *pSrc;
  char *pDst;
  size_t readable;
  Buffer *this_local;
  
  if (this->m_readerIndex != this->m_nCheapPrepend) {
    sVar1 = readableBytes(this);
    pcVar2 = begin(this);
    sVar4 = this->m_nCheapPrepend;
    pcVar3 = begin(this);
    memmove(pcVar2 + sVar4,pcVar3 + this->m_readerIndex,this->m_writerIndex - this->m_readerIndex);
    this->m_readerIndex = this->m_nCheapPrepend;
    this->m_writerIndex = this->m_readerIndex + sVar1;
    sVar4 = readableBytes(this);
    if (sVar1 != sVar4) {
      __assert_fail("readable == readableBytes()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Buffer.h"
                    ,0x17f,"void sznet::net::Buffer::wrapBuffer()");
    }
  }
  return;
}

Assistant:

void wrapBuffer()
	{
		if (m_readerIndex == m_nCheapPrepend)
		{
			return;
		}

		// �ɶ����ݳ���
		size_t readable = readableBytes();
		// std::copy(begin() + m_readerIndex, begin() + m_writerIndex, begin() + m_nCheapPrepend);
		char* pDst = begin() + m_nCheapPrepend;
		char* pSrc = begin() + m_readerIndex;
		size_t writeSize = m_writerIndex - m_readerIndex;
		memmove(pDst, pSrc, writeSize);
		m_readerIndex = m_nCheapPrepend;
		m_writerIndex = m_readerIndex + readable;
		assert(readable == readableBytes());
	}